

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O2

handle pybind11::detail::
       eigen_array_cast<pybind11::detail::EigenProps<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
                 (Type *src,handle base,bool writeable)

{
  array aVar1;
  array a;
  array local_98;
  array local_90;
  _Vector_base<long,_std::allocator<long>_> local_88;
  _Vector_base<long,_std::allocator<long>_> local_70;
  Index local_58;
  Index IStack_50;
  long local_48 [2];
  initializer_list<long> local_38;
  initializer_list<long> local_28;
  
  array::array(&local_98);
  local_58 = (src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
             m_rows;
  IStack_50 = (src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
              m_cols;
  local_28._M_array = &local_58;
  local_28._M_len = 2;
  any_container<long>::any_container<long,void>((any_container<long> *)&local_70,&local_28);
  local_48[0] = (src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                m_cols << 3;
  local_38._M_array = local_48;
  local_48[1] = 8;
  local_38._M_len = 2;
  any_container<long>::any_container<long,void>((any_container<long> *)&local_88,&local_38);
  array::array<double>
            (&local_90,(ShapeContainer *)&local_70,(StridesContainer *)&local_88,
             (src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
             m_data,base);
  object::operator=((object *)&local_98,(object *)&local_90);
  object::~object((object *)&local_90);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_88);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_70);
  aVar1.super_buffer.super_object.super_handle.m_ptr =
       local_98.super_buffer.super_object.super_handle.m_ptr;
  if (!writeable) {
    *(byte *)((long)local_98.super_buffer.super_object.super_handle.m_ptr + 0x41) =
         *(byte *)((long)local_98.super_buffer.super_object.super_handle.m_ptr + 0x41) & 0xfb;
  }
  local_98.super_buffer.super_object.super_handle.m_ptr = (buffer)(object)0x0;
  object::~object((object *)&local_98);
  return (handle)(PyObject *)aVar1.super_buffer.super_object.super_handle.m_ptr;
}

Assistant:

handle eigen_array_cast(typename props::Type const &src, handle base = handle(), bool writeable = true) {
    constexpr ssize_t elem_size = sizeof(typename props::Scalar);
    array a;
    if (props::vector)
        a = array({ src.size() }, { elem_size * src.innerStride() }, src.data(), base);
    else
        a = array({ src.rows(), src.cols() }, { elem_size * src.rowStride(), elem_size * src.colStride() },
                  src.data(), base);

    if (!writeable)
        array_proxy(a.ptr())->flags &= ~detail::npy_api::NPY_ARRAY_WRITEABLE_;

    return a.release();
}